

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_vector.c
# Opt level: O0

void vector_push_back(vector v,void *element)

{
  int iVar1;
  void *__dest;
  void *in_RSI;
  vector in_RDI;
  
  if (in_RDI != (vector)0x0) {
    if ((in_RDI->size == in_RDI->capacity) &&
       (iVar1 = vector_reserve(in_RDI,(size_t)in_RSI), iVar1 != 0)) {
      log_write_impl_va("metacall",0x132,"vector_push_back",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/adt/source/adt_vector.c"
                        ,LOG_LEVEL_ERROR,"Vector reserve error");
    }
    else {
      __dest = vector_data_offset_bytes(in_RDI,in_RDI->size * in_RDI->type_size);
      memcpy(__dest,in_RSI,in_RDI->type_size);
      in_RDI->size = in_RDI->size + 1;
    }
  }
  return;
}

Assistant:

void vector_push_back(vector v, void *element)
{
	if (v != NULL)
	{
		if (v->size == v->capacity)
		{
			if (vector_reserve(v, v->capacity * VECTOR_CAPACITY_INCREMENT) != 0)
			{
				log_write("metacall", LOG_LEVEL_ERROR, "Vector reserve error");

				return;
			}
		}

		memcpy(vector_data_offset_bytes(v, v->size * v->type_size), element, v->type_size);

		++v->size;
	}
}